

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O2

void __thiscall
toml::result<toml::detail::region,_toml::detail::none_t>::result
          (result<toml::detail::region,_toml::detail::none_t> *this,
          result<toml::detail::region,_toml::detail::none_t> *other)

{
  bool bVar1;
  
  bVar1 = other->is_ok_;
  this->is_ok_ = bVar1;
  if (bVar1 == true) {
    detail::region::region(&(this->field_1).succ.value,&(other->field_1).succ.value);
    return;
  }
  return;
}

Assistant:

bool is_ok()  const noexcept {return is_ok_;}